

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::Implicit_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<(anonymous_namespace)::Implicit_const&> *this,Implicit *rhs)

{
  Implicit *lhs;
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [32];
  lest local_98 [32];
  string local_78 [36];
  int local_54;
  int local_50;
  bool local_49;
  result local_48;
  Implicit *local_20;
  Implicit *rhs_local;
  expression_lhs<const_(anonymous_namespace)::Implicit_&> *this_local;
  
  local_50 = **(int **)this;
  local_54 = rhs->x;
  local_20 = rhs;
  rhs_local = (Implicit *)this;
  this_local = (expression_lhs<const_(anonymous_namespace)::Implicit_&> *)__return_storage_ptr__;
  local_49 = anon_unknown.dwarf_1346e::operator==((Implicit)local_50,(Implicit)local_54);
  lhs = *(Implicit **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"==",&local_d9);
  std::__cxx11::string::string(local_b8,local_d8);
  to_string<(anonymous_namespace)::Implicit,(anonymous_namespace)::Implicit>
            (local_98,lhs,(string *)local_b8,local_20);
  std::__cxx11::string::string(local_78,(string *)local_98);
  result::result<bool>(&local_48,&local_49,(text *)local_78);
  result::result(__return_storage_ptr__,&local_48);
  result::~result(&local_48);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result( lhs == rhs, to_string( lhs, "==", rhs ) ); }